

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 VmGetNextLine(SyString *pCursor,SyString *pCurrent)

{
  char *pcVar1;
  char cVar2;
  char *pcVar3;
  ushort **ppuVar4;
  char *pcVar5;
  uint uVar6;
  char *pcVar7;
  ulong uVar8;
  
  uVar8 = (ulong)pCursor->nByte;
  while( true ) {
    if ((uint)uVar8 == 0) {
      pCurrent->zString = (char *)0x0;
      pCurrent->nByte = 0;
      return -0x12;
    }
    pcVar3 = pCursor->zString;
    cVar2 = *pcVar3;
    if ((0xffffffffffffffbf < (ulong)(long)cVar2) ||
       (ppuVar4 = __ctype_b_loc(), (*(byte *)((long)*ppuVar4 + (long)cVar2 * 2 + 1) & 0x20) == 0))
    break;
    uVar8 = uVar8 - 1;
    pCursor->nByte = (uint)uVar8;
    pCursor->zString = pcVar3 + 1;
  }
  pcVar1 = pcVar3 + uVar8;
  for (pcVar5 = pcVar3 + 3; pcVar7 = pcVar5 + -3, pcVar7 < pcVar1; pcVar5 = pcVar5 + 4) {
    if ((*pcVar7 == '\n') || (*pcVar7 == '\r')) {
LAB_0011fb75:
      pCurrent->zString = pcVar3;
      uVar6 = (uint)((long)pcVar7 - (long)pcVar3);
      pCurrent->nByte = uVar6;
      pCursor->zString = pcVar3 + ((long)pcVar7 - (long)pcVar3 & 0xffffffff);
      pCursor->nByte = pCursor->nByte - uVar6;
      return 0;
    }
    pcVar7 = pcVar5 + -2;
    if (pcVar1 <= pcVar7) break;
    if ((*pcVar7 == '\n') || (*pcVar7 == '\r')) goto LAB_0011fb75;
    pcVar7 = pcVar5 + -1;
    if (pcVar1 <= pcVar7) break;
    if ((*pcVar7 == '\n') || (*pcVar7 == '\r')) goto LAB_0011fb75;
    if (pcVar1 <= pcVar5) break;
    pcVar7 = pcVar5;
    if ((*pcVar5 == '\n') || (*pcVar5 == '\r')) goto LAB_0011fb75;
  }
  pCurrent->zString = pcVar3;
  pCurrent->nByte = (uint)uVar8;
  return -8;
}

Assistant:

static sxi32 VmGetNextLine(SyString *pCursor, SyString *pCurrent)
{ 
  	const char *zIn;
  	sxu32 nPos; 
	/* Jump leading white spaces */
	SyStringLeftTrim(pCursor);
	if( pCursor->nByte < 1 ){
		SyStringInitFromBuf(pCurrent, 0, 0);
		return SXERR_EOF; /* End of input */
	}
	zIn = SyStringData(pCursor);
	if( SXRET_OK != SyByteListFind(pCursor->zString, pCursor->nByte, "\r\n", &nPos) ){
		/* Line not found, tell the caller to read more input from source */
		SyStringDupPtr(pCurrent, pCursor);
		return SXERR_MORE;
	}
  	pCurrent->zString = zIn;
  	pCurrent->nByte	= nPos;	
  	/* advance the cursor so we can call this routine again */
  	pCursor->zString = &zIn[nPos];
  	pCursor->nByte -= nPos;
  	return SXRET_OK;
 }